

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

void __thiscall Table::dbOpen(Table *this,string *filename)

{
  Pager *this_00;
  pointer pcVar1;
  char *node;
  string local_40;
  
  this_00 = this->pager;
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + filename->_M_string_length);
  Pager::_open(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this->rootPageNum = 0;
  if (this->pager->numOfPages == 0) {
    node = Pager::getPage(this->pager,0);
    initialize_leaf_node(node);
    set_node_root(node,true);
  }
  return;
}

Assistant:

void Table::dbOpen(std::string filename) {
    pager->_open(filename);
    rootPageNum = 0;
    if (pager->getNumOfPages() == 0) {
        char *rootNode = pager->getPage(0);
        initialize_leaf_node(rootNode);
		set_node_root(rootNode, true);
    }
}